

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::Texture2DArraySpecCase::verifyTexture
          (Texture2DArraySpecCase *this,GLContext *gles3Context,ReferenceContext *refContext)

{
  ContextWrapper *this_00;
  TestLog *log;
  deUint32 program;
  Surface *dst;
  Texture2DArraySpecCase *pTVar1;
  _Alloc_hider imageSetDesc;
  _Alloc_hider imageSetName;
  bool bVar2;
  DataType samplerType;
  undefined8 extraout_RAX;
  RenderTarget *pRVar3;
  int iVar4;
  ReferenceContext *pRVar5;
  int local_314;
  int local_310;
  allocator<char> local_309;
  Texture2DArraySpecCase *local_308;
  uint local_2fc;
  deUint32 local_2f8;
  deUint32 local_2f4;
  int local_2f0;
  int local_2ec;
  ReferenceContext *local_2e8;
  string desc;
  Surface result;
  Surface reference;
  string layerStr;
  string levelStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string name;
  UVec4 threshold;
  ConstPixelBufferAccess local_200;
  ConstPixelBufferAccess local_1d8;
  Texture2DArrayShader shader;
  
  samplerType = glu::getSampler2DArrayType(this->m_texFormat);
  FboTestUtil::Texture2DArrayShader::Texture2DArrayShader(&shader,samplerType,TYPE_FLOAT_VEC4);
  local_2e8 = (ReferenceContext *)gles3Context;
  local_2f4 = (*(gles3Context->super_Context)._vptr_Context[0x75])(gles3Context,&shader);
  local_2f8 = (*(refContext->super_Context)._vptr_Context[0x75])(refContext,&shader);
  FboTestUtil::Texture2DArrayShader::setTexScaleBias
            (&shader,&(this->m_texFormatInfo).lookupScale,&(this->m_texFormatInfo).lookupBias);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  iVar4 = 2;
  while (iVar4 != 0) {
    pRVar5 = refContext;
    if (iVar4 == 2) {
      pRVar5 = local_2e8;
    }
    sglr::ContextWrapper::setContext(this_00,&pRVar5->super_Context);
    sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2700);
    sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
    sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x8072,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x813d,this->m_numLevels + -1);
    iVar4 = iVar4 + -1;
  }
  local_308 = this;
  for (local_310 = 0; local_310 < local_308->m_numLayers; local_310 = local_310 + 1) {
    FboTestUtil::Texture2DArrayShader::setLayer(&shader,local_310);
    local_2fc = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    for (local_314 = 0; local_314 < local_308->m_numLevels; local_314 = local_314 + 1) {
      local_2ec = local_308->m_width >> ((byte)local_314 & 0x1f);
      if (local_2ec < 2) {
        local_2ec = 1;
      }
      local_2f0 = local_308->m_height >> ((byte)local_314 & 0x1f);
      if (local_2f0 < 2) {
        local_2f0 = 1;
      }
      tcu::Surface::Surface(&reference);
      tcu::Surface::Surface(&result);
      iVar4 = 2;
      while( true ) {
        pTVar1 = local_308;
        if (iVar4 == 0) break;
        program = local_2f8;
        dst = &reference;
        pRVar5 = refContext;
        if (iVar4 == 2) {
          program = local_2f4;
          dst = &result;
          pRVar5 = local_2e8;
        }
        sglr::ContextWrapper::setContext(this_00,&pRVar5->super_Context);
        FboTestUtil::Texture2DArrayShader::setUniforms(&shader,&pRVar5->super_Context,program);
        TextureSpecCase::renderTex
                  (&local_308->super_TextureSpecCase,dst,program,local_2ec,local_2f0);
        iVar4 = iVar4 + -1;
      }
      pRVar3 = Context::getRenderTarget((local_308->super_TextureSpecCase).super_TestCase.m_context)
      ;
      computeCompareThreshold((Functional *)&threshold,&pRVar3->m_pixelFormat,pTVar1->m_texFormat);
      de::toString<int>(&levelStr,&local_314);
      de::toString<int>(&layerStr,&local_310);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&desc,"Layer",(allocator<char> *)&local_250);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200
                     ,&desc,&layerStr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_200,"Level");
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1d8,&levelStr);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"Layer ",&local_309);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200
                     ,&local_250,&layerStr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_200,", Level ");
      std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1d8,&levelStr);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_250);
      imageSetName = name._M_dataplus;
      imageSetDesc = desc._M_dataplus;
      log = ((local_308->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
            m_testCtx)->m_log;
      tcu::Surface::getAccess((PixelBufferAccess *)&local_1d8,&reference);
      tcu::Surface::getAccess((PixelBufferAccess *)&local_200,&result);
      bVar2 = tcu::intThresholdCompare
                        (log,imageSetName._M_p,imageSetDesc._M_p,&local_1d8,&local_200,&threshold,
                         (local_310 != 0 || local_314 != 0) + COMPARE_LOG_RESULT);
      if (!bVar2) {
        tcu::TestContext::setTestResult
                  ((local_308->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Image comparison failed");
        local_2fc = 0;
      }
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&layerStr);
      std::__cxx11::string::~string((string *)&levelStr);
      tcu::Surface::~Surface(&result);
      tcu::Surface::~Surface(&reference);
      if (!bVar2) break;
    }
    if ((local_2fc & 1) == 0) break;
  }
  sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
  return;
}

Assistant:

void Texture2DArraySpecCase::verifyTexture (sglr::GLContext& gles3Context, sglr::ReferenceContext& refContext)
{
	Texture2DArrayShader	shader			(glu::getSampler2DArrayType(m_texFormat), glu::TYPE_FLOAT_VEC4);
	deUint32				shaderIDgles	= gles3Context.createProgram(&shader);
	deUint32				shaderIDRef		= refContext.createProgram(&shader);

	shader.setTexScaleBias(m_texFormatInfo.lookupScale, m_texFormatInfo.lookupBias);

	// Set state.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		sglr::Context* ctx = ndx ? static_cast<sglr::Context*>(&refContext) : static_cast<sglr::Context*>(&gles3Context);

		setContext(ctx);

		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_R,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAX_LEVEL,	m_numLevels-1);
	}

	for (int layerNdx = 0; layerNdx < m_numLayers; layerNdx++)
	{
		bool layerOk = true;

		shader.setLayer(layerNdx);

		for (int levelNdx = 0; levelNdx < m_numLevels; levelNdx++)
		{
			int				levelW		= de::max(1, m_width	>> levelNdx);
			int				levelH		= de::max(1, m_height	>> levelNdx);
			tcu::Surface	reference;
			tcu::Surface	result;

			for (int ndx = 0; ndx < 2; ndx++)
			{
				tcu::Surface&	dst			= ndx ? reference									: result;
				sglr::Context*	ctx			= ndx ? static_cast<sglr::Context*>(&refContext)	: static_cast<sglr::Context*>(&gles3Context);
				deUint32		shaderID	= ndx ? shaderIDRef									: shaderIDgles;

				setContext(ctx);
				shader.setUniforms(*ctx, shaderID);
				renderTex(dst, shaderID, levelW, levelH);
			}

			UVec4			threshold	= computeCompareThreshold(m_context.getRenderTarget().getPixelFormat(), m_texFormat);
			string			levelStr	= de::toString(levelNdx);
			string			layerStr	= de::toString(layerNdx);
			string			name		= string("Layer") + layerStr + "Level" + levelStr;
			string			desc		= string("Layer ") + layerStr + ", Level " + levelStr;
			bool			depthOk		= tcu::intThresholdCompare(m_testCtx.getLog(), name.c_str(), desc.c_str(), reference.getAccess(), result.getAccess(), threshold,
																   (levelNdx == 0 && layerNdx == 0) ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

			if (!depthOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				layerOk = false;
				break;
			}
		}

		if (!layerOk)
			break;
	}
}